

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsplitter.cpp
# Opt level: O1

int __thiscall QSplitter::qt_metacall(QSplitter *this,Call _c,int _id,void **_a)

{
  int _id_00;
  QSplitter *_t;
  long in_FS_OFFSET;
  undefined4 local_50;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  undefined4 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  _id_00 = QFrame::qt_metacall(&this->super_QFrame,_c,_id,_a);
  if (-1 < _id_00) {
    if (_c == InvokeMetaMethod) {
      if (_id_00 == 0) {
        local_4c = *_a[1];
        local_50 = *_a[2];
        puStack_40 = &local_4c;
        local_38 = &local_50;
        local_48 = (void *)0x0;
        QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_48);
      }
      _id_00 = _id_00 + -1;
    }
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 1) {
        *(undefined8 *)*_a = 0;
      }
      _id_00 = _id_00 + -1;
    }
    if ((_c < CustomCall) && ((0x14eU >> (_c & 0x1f) & 1) != 0)) {
      qt_static_metacall((QObject *)this,_c,_id_00,_a);
      _id_00 = _id_00 + -4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return _id_00;
  }
  __stack_chk_fail();
}

Assistant:

int QSplitter::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QFrame::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    return _id;
}